

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O1

AST * parse_finish_while_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST_While_Statement *error;
  AST *pAVar2;
  AST_Error *pAVar3;
  char *error_message;
  
  error = get_while_statement_tree();
  cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
  if (cVar1 == '\0') {
    error_message = " \'(\' expected";
  }
  else {
    pAVar2 = parse_expression(translation_data,scope);
    error->condition = pAVar2;
    cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
    if (cVar1 != '\0') {
      pAVar2 = parse_statement(translation_data,scope);
      error->body_statement = pAVar2;
      return (AST *)error;
    }
    error_message = " \')\' expected";
  }
  push_translation_error(error_message,translation_data);
  pAVar3 = get_error_tree((AST *)error);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_finish_while_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_While_Statement *hold;
	hold=get_while_statement_tree();
	if(get_and_check(translation_data,KW_OPEN_NORMAL))
	{
		hold->condition=parse_expression(translation_data,scope);
		if(get_and_check(translation_data,KW_CLOSE_NORMAL))
		{
			hold->body_statement=parse_statement(translation_data,scope);
		}else
		{
			push_translation_error(" ')' expected",translation_data);
			return (struct AST*)get_error_tree((struct AST*)hold);
		}
	}else
	{
		push_translation_error(" '(' expected",translation_data);
		return (struct AST*)get_error_tree((struct AST*)hold);
	}

	return (struct AST*)hold;
}